

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jasmin.cpp
# Opt level: O3

void __thiscall Oric::Jasmin::set_activity_observer(Jasmin *this,Observer *observer)

{
  Observer *pOVar1;
  long *local_38 [2];
  long local_28 [2];
  
  this->observer_ = observer;
  if (observer != (Observer *)0x0) {
    local_38[0] = local_28;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_38,"Jasmin","");
    (*observer->_vptr_Observer[2])(observer,local_38,0);
    if (local_38[0] != local_28) {
      operator_delete(local_38[0],local_28[0] + 1);
    }
    pOVar1 = this->observer_;
    local_38[0] = local_28;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_38,"Jasmin","");
    (*pOVar1->_vptr_Observer[4])
              (pOVar1,local_38,(ulong)(byte)(this->super_DiskController).field_0x4e4);
    if (local_38[0] != local_28) {
      operator_delete(local_38[0],local_28[0] + 1);
    }
  }
  return;
}

Assistant:

void Jasmin::set_activity_observer(Activity::Observer *observer) {
	observer_ = observer;
	if(observer) {
		observer->register_led("Jasmin");
		observer_->set_led_status("Jasmin", motor_on_);
	}
}